

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rules_tria.cc
# Opt level: O3

QuadRule * lf::quad::detail::HardcodedQuadRule<(lf::base::RefElType)3,22>(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_88;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  VectorXd local_50;
  MatrixXd local_40;
  
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  local_88.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_88,2,0x60);
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_68,0x60);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,0)
  ;
  *pSVar1 = 0.3851845246273021;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,0)
  ;
  *pSVar1 = 0.2296309507453958;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,1)
  ;
  *pSVar1 = 0.3851845246273021;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,1)
  ;
  *pSVar1 = 0.3851845246273022;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,2)
  ;
  *pSVar1 = 0.2296309507453957;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,2)
  ;
  *pSVar1 = 0.38518452462730224;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,3)
  ;
  *pSVar1 = 0.4577694113676721;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,3)
  ;
  *pSVar1 = 0.08446117726465589;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,4)
  ;
  *pSVar1 = 0.4577694113676721;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,4)
  ;
  *pSVar1 = 0.45776941136767213;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,5)
  ;
  *pSVar1 = 0.08446117726465585;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,5)
  ;
  *pSVar1 = 0.45776941136767224;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,6)
  ;
  *pSVar1 = 0.06984216946744362;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,6)
  ;
  *pSVar1 = 0.007876282221582378;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,7)
  ;
  *pSVar1 = 0.922281548310974;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,7)
  ;
  *pSVar1 = 0.06984216946744361;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,8)
  ;
  *pSVar1 = 0.007876282221582431;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,8)
  ;
  *pSVar1 = 0.9222815483109743;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,9)
  ;
  *pSVar1 = 0.922281548310974;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,9)
  ;
  *pSVar1 = 0.007876282221582378;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,10
                     );
  *pSVar1 = 0.0698421694674436;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,10
                     );
  *pSVar1 = 0.9222815483109743;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xb);
  *pSVar1 = 0.007876282221582098;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xb);
  *pSVar1 = 0.06984216946744393;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xc);
  *pSVar1 = 0.29455825902995003;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xc);
  *pSVar1 = 0.2945582590299502;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xd);
  *pSVar1 = 0.4108834819400997;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xd);
  *pSVar1 = 0.2945582590299502;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xe);
  *pSVar1 = 0.2945582590299501;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xe);
  *pSVar1 = 0.4108834819400998;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xf);
  *pSVar1 = 0.18851052363028384;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xf);
  *pSVar1 = 0.18851052363028403;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x10);
  *pSVar1 = 0.622978952739432;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x10);
  *pSVar1 = 0.18851052363028387;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x11);
  *pSVar1 = 0.1885105236302841;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x11);
  *pSVar1 = 0.6229789527394323;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x12);
  *pSVar1 = 0.42198188879353493;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x12);
  *pSVar1 = 0.15603622241293016;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x13);
  *pSVar1 = 0.4219818887935349;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x13);
  *pSVar1 = 0.42198188879353504;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x14);
  *pSVar1 = 0.15603622241293005;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x14);
  *pSVar1 = 0.4219818887935351;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x15);
  *pSVar1 = 0.09039883116640773;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x15);
  *pSVar1 = 0.04475228434833589;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x16);
  *pSVar1 = 0.8648488844852564;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x16);
  *pSVar1 = 0.09039883116640778;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x17);
  *pSVar1 = 0.044752284348336;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x17);
  *pSVar1 = 0.8648488844852564;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x18);
  *pSVar1 = 0.8648488844852564;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x18);
  *pSVar1 = 0.04475228434833589;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x19);
  *pSVar1 = 0.0903988311664079;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x19);
  *pSVar1 = 0.8648488844852564;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1a);
  *pSVar1 = 0.0447522843483357;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1a);
  *pSVar1 = 0.09039883116640807;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1b);
  *pSVar1 = 0.4113417640205587;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1b);
  *pSVar1 = 0.03827523470086384;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1c);
  *pSVar1 = 0.5503830012785774;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1c);
  *pSVar1 = 0.4113417640205588;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1d);
  *pSVar1 = 0.0382752347008638;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1d);
  *pSVar1 = 0.5503830012785776;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1e);
  *pSVar1 = 0.5503830012785774;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1e);
  *pSVar1 = 0.03827523470086384;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1f);
  *pSVar1 = 0.4113417640205588;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1f);
  *pSVar1 = 0.5503830012785775;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x20);
  *pSVar1 = 0.03827523470086369;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x20);
  *pSVar1 = 0.411341764020559;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x21);
  *pSVar1 = 0.33210610500744636;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x21);
  *pSVar1 = 0.10274707598693143;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x22);
  *pSVar1 = 0.5651468190056221;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x22);
  *pSVar1 = 0.3321061050074464;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x23);
  *pSVar1 = 0.10274707598693145;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x23);
  *pSVar1 = 0.5651468190056224;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x24);
  *pSVar1 = 0.5651468190056222;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x24);
  *pSVar1 = 0.10274707598693143;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x25);
  *pSVar1 = 0.3321061050074463;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x25);
  *pSVar1 = 0.5651468190056224;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x26);
  *pSVar1 = 0.10274707598693128;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x26);
  *pSVar1 = 0.33210610500744664;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x27);
  *pSVar1 = 0.36257628043246726;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x27);
  *pSVar1 = 0.007400241234710754;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x28);
  *pSVar1 = 0.630023478332822;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x28);
  *pSVar1 = 0.3625762804324673;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x29);
  *pSVar1 = 0.0074002412347107804;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x29);
  *pSVar1 = 0.6300234783328221;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x2a);
  *pSVar1 = 0.630023478332822;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x2a);
  *pSVar1 = 0.007400241234710754;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x2b);
  *pSVar1 = 0.3625762804324673;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x2b);
  *pSVar1 = 0.6300234783328221;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x2c);
  *pSVar1 = 0.007400241234710669;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x2c);
  *pSVar1 = 0.3625762804324675;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x2d);
  *pSVar1 = 0.2900668241166688;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x2d);
  *pSVar1 = 0.19108129796672016;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x2e);
  *pSVar1 = 0.518851877916611;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x2e);
  *pSVar1 = 0.29006682411666884;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x2f);
  *pSVar1 = 0.19108129796672013;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x2f);
  *pSVar1 = 0.5188518779166111;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x30);
  *pSVar1 = 0.518851877916611;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x30);
  *pSVar1 = 0.19108129796672016;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x31);
  *pSVar1 = 0.29006682411666884;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x31);
  *pSVar1 = 0.5188518779166111;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x32);
  *pSVar1 = 0.19108129796672002;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x32);
  *pSVar1 = 0.29006682411666895;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x33);
  *pSVar1 = 0.49616117840970864;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x33);
  *pSVar1 = 0.007677643180582776;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x34);
  *pSVar1 = 0.49616117840970864;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x34);
  *pSVar1 = 0.4961611784097087;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x35);
  *pSVar1 = 0.007677643180582727;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x35);
  *pSVar1 = 0.49616117840970886;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x36);
  *pSVar1 = 0.2879318028241718;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x36);
  *pSVar1 = 0.04399164539345586;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x37);
  *pSVar1 = 0.6680765517823724;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x37);
  *pSVar1 = 0.28793180282417186;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x38);
  *pSVar1 = 0.0439916453934559;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x38);
  *pSVar1 = 0.6680765517823725;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x39);
  *pSVar1 = 0.6680765517823722;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x39);
  *pSVar1 = 0.04399164539345586;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x3a);
  *pSVar1 = 0.2879318028241718;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x3a);
  *pSVar1 = 0.6680765517823725;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x3b);
  *pSVar1 = 0.04399164539345568;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x3b);
  *pSVar1 = 0.2879318028241721;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x3c);
  *pSVar1 = 0.21678693336494115;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x3c);
  *pSVar1 = 0.10868994186267203;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x3d);
  *pSVar1 = 0.6745231247723867;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x3d);
  *pSVar1 = 0.21678693336494118;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x3e);
  *pSVar1 = 0.10868994186267206;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x3e);
  *pSVar1 = 0.674523124772387;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x3f);
  *pSVar1 = 0.6745231247723867;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x3f);
  *pSVar1 = 0.10868994186267203;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x40);
  *pSVar1 = 0.2167869333649412;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x40);
  *pSVar1 = 0.674523124772387;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x41);
  *pSVar1 = 0.10868994186267183;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x41);
  *pSVar1 = 0.21678693336494137;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x42);
  *pSVar1 = 0.14587371987352518;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x42);
  *pSVar1 = 0.009144711374964058;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x43);
  *pSVar1 = 0.8449815687515108;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x43);
  *pSVar1 = 0.14587371987352518;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x44);
  *pSVar1 = 0.009144711374964143;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x44);
  *pSVar1 = 0.8449815687515109;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x45);
  *pSVar1 = 0.8449815687515108;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x45);
  *pSVar1 = 0.009144711374964058;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x46);
  *pSVar1 = 0.1458737198735252;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x46);
  *pSVar1 = 0.8449815687515109;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x47);
  *pSVar1 = 0.009144711374963796;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x47);
  *pSVar1 = 0.14587371987352551;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x48);
  *pSVar1 = 0.17629743482450005;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x48);
  *pSVar1 = 0.048254924114641405;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x49);
  *pSVar1 = 0.7754476410608585;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x49);
  *pSVar1 = 0.17629743482450005;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x4a);
  *pSVar1 = 0.04825492411464144;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x4a);
  *pSVar1 = 0.7754476410608587;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x4b);
  *pSVar1 = 0.7754476410608585;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x4b);
  *pSVar1 = 0.048254924114641405;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x4c);
  *pSVar1 = 0.17629743482450005;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x4c);
  *pSVar1 = 0.7754476410608587;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x4d);
  *pSVar1 = 0.048254924114641204;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x4d);
  *pSVar1 = 0.17629743482450036;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x4e);
  *pSVar1 = 0.24399064603949305;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x4e);
  *pSVar1 = 0.009163909248185232;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x4f);
  *pSVar1 = 0.7468454447123216;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x4f);
  *pSVar1 = 0.24399064603949305;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x50);
  *pSVar1 = 0.009163909248185331;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x50);
  *pSVar1 = 0.7468454447123218;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x51);
  *pSVar1 = 0.7468454447123217;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x51);
  *pSVar1 = 0.009163909248185232;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x52);
  *pSVar1 = 0.24399064603949305;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x52);
  *pSVar1 = 0.7468454447123218;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x53);
  *pSVar1 = 0.009163909248185054;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x53);
  *pSVar1 = 0.2439906460394934;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x54);
  *pSVar1 = 0.02910847067080736;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x54);
  *pSVar1 = 0.02910847067080767;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x55);
  *pSVar1 = 0.941783058658385;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x55);
  *pSVar1 = 0.029108470670807348;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x56);
  *pSVar1 = 0.02910847067080785;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x56);
  *pSVar1 = 0.941783058658385;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x57);
  *pSVar1 = 0.11543153821920489;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x57);
  *pSVar1 = 0.11543153821920513;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x58);
  *pSVar1 = 0.76913692356159;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x58);
  *pSVar1 = 0.1154315382192049;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x59);
  *pSVar1 = 0.11543153821920515;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x59);
  *pSVar1 = 0.7691369235615901;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x5a);
  *pSVar1 = 0.017934321052938986;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x5a);
  *pSVar1 = 0.001798464988948375;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x5b);
  *pSVar1 = 0.9802672139581126;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x5b);
  *pSVar1 = 0.01793432105293897;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x5c);
  *pSVar1 = 0.0017984649889485893;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x5c);
  *pSVar1 = 0.9802672139581127;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x5d);
  *pSVar1 = 0.9802672139581127;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x5d);
  *pSVar1 = 0.001798464988948375;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x5e);
  *pSVar1 = 0.017934321052939073;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x5e);
  *pSVar1 = 0.9802672139581129;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x5f);
  *pSVar1 = 0.001798464988948121;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x5f);
  *pSVar1 = 0.017934321052939288;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0);
  *pSVar2 = 0.006746541941805332;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,1);
  *pSVar2 = 0.006746541941805332;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,2);
  *pSVar2 = 0.006746541941805332;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,3);
  *pSVar2 = 0.006930699762117097;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,4);
  *pSVar2 = 0.006930699762117097;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,5);
  *pSVar2 = 0.006930699762117097;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,6);
  *pSVar2 = 0.0012977192371156389;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,7);
  *pSVar2 = 0.0012977192371156389;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,8);
  *pSVar2 = 0.0012977192371156389;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,9);
  *pSVar2 = 0.0012977192371156389;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,10);
  *pSVar2 = 0.0012977192371156389;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xb);
  *pSVar2 = 0.0012977192371156389;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xc);
  *pSVar2 = 0.010537881978726092;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xd);
  *pSVar2 = 0.010537881978726092;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xe);
  *pSVar2 = 0.010537881978726092;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xf);
  *pSVar2 = 0.008010649562574447;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x10);
  *pSVar2 = 0.008010649562574447;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x11);
  *pSVar2 = 0.008010649562574447;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x12);
  *pSVar2 = 0.009426546276920644;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x13);
  *pSVar2 = 0.009426546276920644;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x14);
  *pSVar2 = 0.009426546276920644;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x15);
  *pSVar2 = 0.0037587889088941885;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x16);
  *pSVar2 = 0.0037587889088941885;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x17);
  *pSVar2 = 0.0037587889088941885;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x18);
  *pSVar2 = 0.0037587889088941885;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x19);
  *pSVar2 = 0.0037587889088941885;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1a);
  *pSVar2 = 0.0037587889088941885;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1b);
  *pSVar2 = 0.005598656735981386;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1c);
  *pSVar2 = 0.005598656735981386;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1d);
  *pSVar2 = 0.005598656735981386;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1e);
  *pSVar2 = 0.005598656735981386;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1f);
  *pSVar2 = 0.005598656735981386;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x20);
  *pSVar2 = 0.005598656735981386;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x21);
  *pSVar2 = 0.00885954674475511;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x22);
  *pSVar2 = 0.00885954674475511;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x23);
  *pSVar2 = 0.00885954674475511;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x24);
  *pSVar2 = 0.00885954674475511;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x25);
  *pSVar2 = 0.00885954674475511;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x26);
  *pSVar2 = 0.00885954674475511;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x27);
  *pSVar2 = 0.0024521301987784827;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x28);
  *pSVar2 = 0.0024521301987784827;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x29);
  *pSVar2 = 0.0024521301987784827;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x2a);
  *pSVar2 = 0.0024521301987784827;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x2b);
  *pSVar2 = 0.0024521301987784827;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x2c);
  *pSVar2 = 0.0024521301987784827;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x2d);
  *pSVar2 = 0.01085320977775448;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x2e);
  *pSVar2 = 0.01085320977775448;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x2f);
  *pSVar2 = 0.01085320977775448;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x30);
  *pSVar2 = 0.01085320977775448;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x31);
  *pSVar2 = 0.01085320977775448;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x32);
  *pSVar2 = 0.01085320977775448;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x33);
  *pSVar2 = 0.0026446698329922096;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x34);
  *pSVar2 = 0.0026446698329922096;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x35);
  *pSVar2 = 0.0026446698329922096;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x36);
  *pSVar2 = 0.005831111433671501;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x37);
  *pSVar2 = 0.005831111433671501;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x38);
  *pSVar2 = 0.005831111433671501;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x39);
  *pSVar2 = 0.005831111433671501;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x3a);
  *pSVar2 = 0.005831111433671501;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x3b);
  *pSVar2 = 0.005831111433671501;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x3c);
  *pSVar2 = 0.007855081311285159;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x3d);
  *pSVar2 = 0.007855081311285159;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x3e);
  *pSVar2 = 0.007855081311285159;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x3f);
  *pSVar2 = 0.007855081311285159;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x40);
  *pSVar2 = 0.007855081311285159;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x41);
  *pSVar2 = 0.007855081311285159;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x42);
  *pSVar2 = 0.002053343535787778;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x43);
  *pSVar2 = 0.002053343535787778;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x44);
  *pSVar2 = 0.002053343535787778;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x45);
  *pSVar2 = 0.002053343535787778;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x46);
  *pSVar2 = 0.002053343535787778;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x47);
  *pSVar2 = 0.002053343535787778;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x48);
  *pSVar2 = 0.0052817924838734496;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x49);
  *pSVar2 = 0.0052817924838734496;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x4a);
  *pSVar2 = 0.0052817924838734496;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x4b);
  *pSVar2 = 0.0052817924838734496;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x4c);
  *pSVar2 = 0.0052817924838734496;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x4d);
  *pSVar2 = 0.0052817924838734496;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x4e);
  *pSVar2 = 0.0025270384487923007;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x4f);
  *pSVar2 = 0.0025270384487923007;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x50);
  *pSVar2 = 0.0025270384487923007;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x51);
  *pSVar2 = 0.0025270384487923007;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x52);
  *pSVar2 = 0.0025270384487923007;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x53);
  *pSVar2 = 0.0025270384487923007;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x54);
  *pSVar2 = 0.0017845545829281884;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x55);
  *pSVar2 = 0.0017845545829281884;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x56);
  *pSVar2 = 0.0017845545829281884;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x57);
  *pSVar2 = 0.007207856564052303;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x58);
  *pSVar2 = 0.007207856564052303;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x59);
  *pSVar2 = 0.007207856564052303;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x5a);
  *pSVar2 = 0.00032021426558571296;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x5b);
  *pSVar2 = 0.00032021426558571296;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x5c);
  *pSVar2 = 0.00032021426558571296;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x5d);
  *pSVar2 = 0.00032021426558571296;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x5e);
  *pSVar2 = 0.00032021426558571296;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x5f);
  *pSVar2 = 0.00032021426558571296;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_88.m_storage.m_data;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_88.m_storage.m_rows;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_88.m_storage.m_cols;
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  local_88.m_storage.m_cols = 0;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_68.m_storage.m_data;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_68.m_storage.m_rows;
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x3,&local_40,&local_50,0x16);
  free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_68.m_storage.m_data);
  free(local_88.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule HardcodedQuadRule<base::RefEl::kTria(), 22>() { // NOLINT
  Eigen::MatrixXd points(2, 96);
  Eigen::VectorXd weights(96);

  points(0, 0) = 0.38518452462730212726;
  points(1, 0) = 0.22963095074539580098;
  points(0, 1) = 0.38518452462730212726;
  points(1, 1) = 0.38518452462730218278;
  points(0, 2) = 0.22963095074539568996;
  points(1, 2) = 0.38518452462730223829;
  points(0, 3) = 0.45776941136767207441;
  points(1, 3) = 0.084461177264655892816;
  points(0, 4) = 0.45776941136767207441;
  points(1, 4) = 0.45776941136767212992;
  points(0, 5) = 0.084461177264655851182;
  points(1, 5) = 0.45776941136767224094;
  points(0, 6) = 0.069842169467443621089;
  points(1, 6) = 0.0078762822215823775213;
  points(0, 7) = 0.92228154831097397537;
  points(1, 7) = 0.069842169467443607211;
  points(0, 8) = 0.0078762822215824312977;
  points(1, 8) = 0.92228154831097430844;
  points(0, 9) = 0.92228154831097397537;
  points(1, 9) = 0.0078762822215823775213;
  points(0, 10) = 0.069842169467443593334;
  points(1, 10) = 0.92228154831097430844;
  points(0, 11) = 0.0078762822215820982308;
  points(1, 11) = 0.069842169467443926401;
  points(0, 12) = 0.2945582590299500314;
  points(1, 12) = 0.29455825902995019794;
  points(0, 13) = 0.41088348194009971515;
  points(1, 13) = 0.29455825902995019794;
  points(0, 14) = 0.29455825902995008692;
  points(1, 14) = 0.41088348194009982617;
  points(0, 15) = 0.18851052363028383829;
  points(1, 15) = 0.18851052363028403258;
  points(0, 16) = 0.62297895273943204586;
  points(1, 16) = 0.18851052363028386605;
  points(0, 17) = 0.18851052363028408809;
  points(1, 17) = 0.6229789527394322679;
  points(0, 18) = 0.42198188879353493164;
  points(1, 18) = 0.15603622241293016448;
  points(0, 19) = 0.42198188879353487613;
  points(1, 19) = 0.42198188879353504266;
  points(0, 20) = 0.15603622241293005346;
  points(1, 20) = 0.42198188879353509817;
  points(0, 21) = 0.09039883116640773375;
  points(1, 21) = 0.044752284348335891195;
  points(0, 22) = 0.86484888448525643057;
  points(1, 22) = 0.090398831166407775384;
  points(0, 23) = 0.044752284348336002218;
  points(1, 23) = 0.86484888448525643057;
  points(0, 24) = 0.86484888448525643057;
  points(1, 24) = 0.044752284348335891195;
  points(0, 25) = 0.090398831166407900284;
  points(1, 25) = 0.86484888448525643057;
  points(0, 26) = 0.044752284348335696906;
  points(1, 26) = 0.090398831166408066817;
  points(0, 27) = 0.41134176402055872002;
  points(1, 27) = 0.038275234700863837445;
  points(0, 28) = 0.55038300127857742172;
  points(1, 28) = 0.41134176402055877553;
  points(0, 29) = 0.03827523470086380275;
  points(1, 29) = 0.55038300127857764377;
  points(0, 30) = 0.55038300127857742172;
  points(1, 30) = 0.038275234700863837445;
  points(0, 31) = 0.41134176402055877553;
  points(1, 31) = 0.55038300127857753274;
  points(0, 32) = 0.038275234700863691728;
  points(1, 32) = 0.41134176402055899757;
  points(0, 33) = 0.33210610500744636164;
  points(1, 33) = 0.10274707598693143262;
  points(0, 34) = 0.56514681900562213634;
  points(1, 34) = 0.33210610500744641715;
  points(0, 35) = 0.1027470759869314465;
  points(1, 35) = 0.56514681900562235839;
  points(0, 36) = 0.56514681900562224737;
  points(1, 36) = 0.10274707598693143262;
  points(0, 37) = 0.33210610500744630613;
  points(1, 37) = 0.56514681900562235839;
  points(0, 38) = 0.10274707598693127997;
  points(1, 38) = 0.3321061050074466392;
  points(0, 39) = 0.36257628043246725724;
  points(1, 39) = 0.0074002412347107544149;
  points(0, 40) = 0.63002347833282201783;
  points(1, 40) = 0.36257628043246731275;
  points(0, 41) = 0.0074002412347107804358;
  points(1, 41) = 0.63002347833282212886;
  points(0, 42) = 0.63002347833282201783;
  points(1, 42) = 0.0074002412347107544149;
  points(0, 43) = 0.36257628043246731275;
  points(1, 43) = 0.63002347833282212886;
  points(0, 44) = 0.0074002412347106694135;
  points(1, 44) = 0.36257628043246747929;
  points(0, 45) = 0.29006682411666878663;
  points(1, 45) = 0.19108129796672015943;
  points(0, 46) = 0.51885187791661102619;
  points(1, 46) = 0.29006682411666884214;
  points(0, 47) = 0.19108129796672013168;
  points(1, 47) = 0.51885187791661113721;
  points(0, 48) = 0.51885187791661102619;
  points(1, 48) = 0.19108129796672015943;
  points(0, 49) = 0.29006682411666884214;
  points(1, 49) = 0.51885187791661113721;
  points(0, 50) = 0.19108129796672002065;
  points(1, 50) = 0.29006682411666895316;
  points(0, 51) = 0.49616117840970863639;
  points(1, 51) = 0.0076776431805827757837;
  points(0, 52) = 0.49616117840970863639;
  points(1, 52) = 0.49616117840970869191;
  points(0, 53) = 0.0076776431805827272115;
  points(1, 53) = 0.49616117840970885844;
  points(0, 54) = 0.28793180282417180083;
  points(1, 54) = 0.043991645393455861002;
  points(0, 55) = 0.66807655178237235205;
  points(1, 55) = 0.28793180282417185634;
  points(0, 56) = 0.043991645393455902635;
  points(1, 56) = 0.66807655178237246307;
  points(0, 57) = 0.66807655178237224103;
  points(1, 57) = 0.043991645393455861002;
  points(0, 58) = 0.28793180282417180083;
  points(1, 58) = 0.66807655178237246307;
  points(0, 59) = 0.04399164539345568059;
  points(1, 59) = 0.28793180282417207838;
  points(0, 60) = 0.21678693336494114785;
  points(1, 60) = 0.10868994186267202928;
  points(0, 61) = 0.6745231247723867396;
  points(1, 61) = 0.21678693336494117561;
  points(0, 62) = 0.10868994186267205704;
  points(1, 62) = 0.67452312477238696165;
  points(0, 63) = 0.6745231247723867396;
  points(1, 63) = 0.10868994186267202928;
  points(0, 64) = 0.21678693336494120336;
  points(1, 64) = 0.67452312477238696165;
  points(0, 65) = 0.10868994186267183499;
  points(1, 65) = 0.2167869333649413699;
  points(0, 66) = 0.14587371987352518166;
  points(1, 66) = 0.0091447113749640578789;
  points(0, 67) = 0.84498156875151075873;
  points(1, 67) = 0.14587371987352518166;
  points(0, 68) = 0.0091447113749641428804;
  points(1, 68) = 0.84498156875151086975;
  points(0, 69) = 0.84498156875151075873;
  points(1, 69) = 0.0091447113749640578789;
  points(0, 70) = 0.14587371987352520941;
  points(1, 70) = 0.84498156875151086975;
  points(0, 71) = 0.0091447113749637959357;
  points(1, 71) = 0.14587371987352551472;
  points(0, 72) = 0.17629743482450005443;
  points(1, 72) = 0.048254924114641405131;
  points(0, 73) = 0.77544764106085850575;
  points(1, 73) = 0.17629743482450005443;
  points(0, 74) = 0.048254924114641439825;
  points(1, 74) = 0.77544764106085872779;
  points(0, 75) = 0.77544764106085850575;
  points(1, 75) = 0.048254924114641405131;
  points(0, 76) = 0.17629743482450005443;
  points(1, 76) = 0.77544764106085872779;
  points(0, 77) = 0.048254924114641203903;
  points(1, 77) = 0.17629743482450035974;
  points(0, 78) = 0.24399064603949305319;
  points(1, 78) = 0.0091639092481852323785;
  points(0, 79) = 0.74684544471232161555;
  points(1, 79) = 0.24399064603949305319;
  points(0, 80) = 0.0091639092481853312577;
  points(1, 80) = 0.7468454447123218376;
  points(0, 81) = 0.74684544471232172658;
  points(1, 81) = 0.0091639092481852323785;
  points(0, 82) = 0.24399064603949305319;
  points(1, 82) = 0.7468454447123218376;
  points(0, 83) = 0.009163909248185053702;
  points(1, 83) = 0.24399064603949338625;
  points(0, 84) = 0.029108470670807358449;
  points(1, 84) = 0.029108470670807670699;
  points(0, 85) = 0.94178305865838496391;
  points(1, 85) = 0.029108470670807348041;
  points(0, 86) = 0.029108470670807851111;
  points(1, 86) = 0.94178305865838496391;
  points(0, 87) = 0.11543153821920489055;
  points(1, 87) = 0.11543153821920512647;
  points(0, 88) = 0.76913692356159002461;
  points(1, 88) = 0.11543153821920490443;
  points(0, 89) = 0.11543153821920515423;
  points(1, 89) = 0.76913692356159013563;
  points(0, 90) = 0.017934321052938986124;
  points(1, 90) = 0.0017984649889483750665;
  points(0, 91) = 0.98026721395811255988;
  points(1, 91) = 0.017934321052938968777;
  points(0, 92) = 0.0017984649889485893048;
  points(1, 92) = 0.9802672139581126709;
  points(0, 93) = 0.9802672139581126709;
  points(1, 93) = 0.0017984649889483750665;
  points(0, 94) = 0.01793432105293907286;
  points(1, 94) = 0.98026721395811289295;
  points(0, 95) = 0.0017984649889481209295;
  points(1, 95) = 0.017934321052939287966;

  weights(0) = 0.0067465419418053316353;
  weights(1) = 0.0067465419418053316353;
  weights(2) = 0.0067465419418053316353;
  weights(3) = 0.0069306997621170970958;
  weights(4) = 0.0069306997621170970958;
  weights(5) = 0.0069306997621170970958;
  weights(6) = 0.001297719237115638885;
  weights(7) = 0.001297719237115638885;
  weights(8) = 0.001297719237115638885;
  weights(9) = 0.001297719237115638885;
  weights(10) = 0.001297719237115638885;
  weights(11) = 0.001297719237115638885;
  weights(12) = 0.010537881978726092169;
  weights(13) = 0.010537881978726092169;
  weights(14) = 0.010537881978726092169;
  weights(15) = 0.0080106495625744469913;
  weights(16) = 0.0080106495625744469913;
  weights(17) = 0.0080106495625744469913;
  weights(18) = 0.0094265462769206435911;
  weights(19) = 0.0094265462769206435911;
  weights(20) = 0.0094265462769206435911;
  weights(21) = 0.0037587889088941885303;
  weights(22) = 0.0037587889088941885303;
  weights(23) = 0.0037587889088941885303;
  weights(24) = 0.0037587889088941885303;
  weights(25) = 0.0037587889088941885303;
  weights(26) = 0.0037587889088941885303;
  weights(27) = 0.0055986567359813856765;
  weights(28) = 0.0055986567359813856765;
  weights(29) = 0.0055986567359813856765;
  weights(30) = 0.0055986567359813856765;
  weights(31) = 0.0055986567359813856765;
  weights(32) = 0.0055986567359813856765;
  weights(33) = 0.008859546744755109407;
  weights(34) = 0.008859546744755109407;
  weights(35) = 0.008859546744755109407;
  weights(36) = 0.008859546744755109407;
  weights(37) = 0.008859546744755109407;
  weights(38) = 0.008859546744755109407;
  weights(39) = 0.0024521301987784826712;
  weights(40) = 0.0024521301987784826712;
  weights(41) = 0.0024521301987784826712;
  weights(42) = 0.0024521301987784826712;
  weights(43) = 0.0024521301987784826712;
  weights(44) = 0.0024521301987784826712;
  weights(45) = 0.01085320977775447969;
  weights(46) = 0.01085320977775447969;
  weights(47) = 0.01085320977775447969;
  weights(48) = 0.01085320977775447969;
  weights(49) = 0.01085320977775447969;
  weights(50) = 0.01085320977775447969;
  weights(51) = 0.0026446698329922095974;
  weights(52) = 0.0026446698329922095974;
  weights(53) = 0.0026446698329922095974;
  weights(54) = 0.0058311114336715014206;
  weights(55) = 0.0058311114336715014206;
  weights(56) = 0.0058311114336715014206;
  weights(57) = 0.0058311114336715014206;
  weights(58) = 0.0058311114336715014206;
  weights(59) = 0.0058311114336715014206;
  weights(60) = 0.0078550813112851589765;
  weights(61) = 0.0078550813112851589765;
  weights(62) = 0.0078550813112851589765;
  weights(63) = 0.0078550813112851589765;
  weights(64) = 0.0078550813112851589765;
  weights(65) = 0.0078550813112851589765;
  weights(66) = 0.0020533435357877778682;
  weights(67) = 0.0020533435357877778682;
  weights(68) = 0.0020533435357877778682;
  weights(69) = 0.0020533435357877778682;
  weights(70) = 0.0020533435357877778682;
  weights(71) = 0.0020533435357877778682;
  weights(72) = 0.0052817924838734495521;
  weights(73) = 0.0052817924838734495521;
  weights(74) = 0.0052817924838734495521;
  weights(75) = 0.0052817924838734495521;
  weights(76) = 0.0052817924838734495521;
  weights(77) = 0.0052817924838734495521;
  weights(78) = 0.0025270384487923007455;
  weights(79) = 0.0025270384487923007455;
  weights(80) = 0.0025270384487923007455;
  weights(81) = 0.0025270384487923007455;
  weights(82) = 0.0025270384487923007455;
  weights(83) = 0.0025270384487923007455;
  weights(84) = 0.0017845545829281884032;
  weights(85) = 0.0017845545829281884032;
  weights(86) = 0.0017845545829281884032;
  weights(87) = 0.0072078565640523025934;
  weights(88) = 0.0072078565640523025934;
  weights(89) = 0.0072078565640523025934;
  weights(90) = 0.00032021426558571296174;
  weights(91) = 0.00032021426558571296174;
  weights(92) = 0.00032021426558571296174;
  weights(93) = 0.00032021426558571296174;
  weights(94) = 0.00032021426558571296174;
  weights(95) = 0.00032021426558571296174;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights), 22);
}